

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroupCommand.cxx
# Opt level: O0

string * anon_unknown.dwarf_45ba03::prepareFilePathForTree
                   (string *__return_storage_ptr__,string *path,string *currentSourceDir)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *currentSourceDir_local;
  string *path_local;
  
  local_20 = currentSourceDir;
  currentSourceDir_local = path;
  path_local = __return_storage_ptr__;
  bVar1 = cmsys::SystemTools::FileIsFullPath(path);
  if (bVar1) {
    cmsys::SystemTools::CollapseFullPath(__return_storage_ptr__,currentSourceDir_local);
  }
  else {
    std::operator+(&local_60,local_20,"/");
    std::operator+(&local_40,&local_60,currentSourceDir_local);
    cmsys::SystemTools::CollapseFullPath(__return_storage_ptr__,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string prepareFilePathForTree(const std::string& path,
                                   const std::string& currentSourceDir)
{
  if (!cmSystemTools::FileIsFullPath(path)) {
    return cmSystemTools::CollapseFullPath(currentSourceDir + "/" + path);
  }
  return cmSystemTools::CollapseFullPath(path);
}